

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexCharlenToBytelen(char *p,int nByte,int nChar)

{
  long lVar1;
  int iVar2;
  int local_28;
  int local_24;
  int i;
  int n;
  int nChar_local;
  int nByte_local;
  char *p_local;
  
  local_24 = 0;
  local_28 = 0;
  do {
    if (nChar <= local_28) {
      return local_24;
    }
    if (nByte <= local_24) {
      return 0;
    }
    iVar2 = local_24 + 1;
    lVar1 = (long)local_24;
    local_24 = iVar2;
    if (0xbf < (byte)p[lVar1]) {
      do {
        if (((int)p[local_24] & 0xc0U) != 0x80) break;
        local_24 = local_24 + 1;
      } while (local_24 < nByte);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static int sqlite3Fts5IndexCharlenToBytelen(
  const char *p, 
  int nByte, 
  int nChar
){
  int n = 0;
  int i;
  for(i=0; i<nChar; i++){
    if( n>=nByte ) return 0;      /* Input contains fewer than nChar chars */
    if( (unsigned char)p[n++]>=0xc0 ){
      while( (p[n] & 0xc0)==0x80 ){
        n++;
        if( n>=nByte ) break;
      }
    }
  }
  return n;
}